

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

int Abc_CexCountOnes(Abc_Cex_t *p)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int local_18;
  int Count;
  int i;
  int nWords;
  Abc_Cex_t *p_local;
  
  iVar1 = Abc_BitWordNum(p->nBits);
  local_1c = 0;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    iVar2 = Abc_CexOnes32((&p[1].iPo)[local_18]);
    local_1c = iVar2 + local_1c;
  }
  return local_1c;
}

Assistant:

int Abc_CexCountOnes( Abc_Cex_t * p )
{
    int nWords = Abc_BitWordNum( p->nBits );
    int i, Count = 0;
    for ( i = 0; i < nWords; i++ )
        Count += Abc_CexOnes32( p->pData[i] );
    return Count;
}